

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cpp
# Opt level: O3

Error __thiscall asmjit::_abi_1_10::BaseBuilder::onDetach(BaseBuilder *this,CodeHolder *code)

{
  void *pvVar1;
  Error EVar2;
  long lVar3;
  ulong uVar4;
  
  uVar4 = (ulong)(this->_passes).super_ZoneVectorBase._size;
  if (uVar4 != 0) {
    pvVar1 = (this->_passes).super_ZoneVectorBase._data;
    lVar3 = 0;
    do {
      (**(code **)**(undefined8 **)((long)pvVar1 + lVar3))();
      lVar3 = lVar3 + 8;
    } while (uVar4 << 3 != lVar3);
  }
  (this->_labelNodes).super_ZoneVectorBase._data = (void *)0x0;
  (this->_labelNodes).super_ZoneVectorBase._size = 0;
  (this->_labelNodes).super_ZoneVectorBase._capacity = 0;
  (this->_sectionNodes).super_ZoneVectorBase._data = (void *)0x0;
  (this->_sectionNodes).super_ZoneVectorBase._size = 0;
  (this->_sectionNodes).super_ZoneVectorBase._capacity = 0;
  (this->_passes).super_ZoneVectorBase._data = (void *)0x0;
  (this->_passes).super_ZoneVectorBase._size = 0;
  (this->_passes).super_ZoneVectorBase._capacity = 0;
  ZoneAllocator::reset(&this->_allocator,&this->_codeZone);
  Zone::reset(&this->_codeZone,kSoft);
  Zone::reset(&this->_dataZone,kSoft);
  Zone::reset(&this->_passZone,kSoft);
  *(undefined8 *)((long)&this->_firstNode + 1) = 0;
  *(undefined8 *)((long)&this->_lastNode + 1) = 0;
  this->_cursor = (BaseNode *)0x0;
  this->_firstNode = (BaseNode *)0x0;
  EVar2 = BaseEmitter::onDetach(&this->super_BaseEmitter,code);
  return EVar2;
}

Assistant:

Error BaseBuilder::onDetach(CodeHolder* code) noexcept {
  BaseBuilder_deletePasses(this);
  _sectionNodes.reset();
  _labelNodes.reset();

  _allocator.reset(&_codeZone);
  _codeZone.reset();
  _dataZone.reset();
  _passZone.reset();

  _nodeFlags = NodeFlags::kNone;
  _cursor = nullptr;
  _firstNode = nullptr;
  _lastNode = nullptr;

  return Base::onDetach(code);
}